

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE_DATA *pAVar2;
  void *__dest;
  int iVar3;
  uint32_t uVar4;
  char *pcVar5;
  ulong __size;
  
  uVar4 = value.length;
  if (uVar4 == 0 || value.bytes != (void *)0x0) {
    pAVar2 = REFCOUNT_AMQP_VALUE_DATA_Create();
    if (pAVar2 == (AMQP_VALUE_DATA *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        pcVar5 = "Could not allocate memory for AMQP value";
        iVar3 = 0x3dd;
        goto LAB_00158634;
      }
    }
    else {
      pAVar2->type = AMQP_TYPE_BINARY;
      __size = value._8_8_ & 0xffffffff;
      if (uVar4 == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(__size);
      }
      (pAVar2->value).binary_value.bytes = __dest;
      (pAVar2->value).binary_value.length = uVar4;
      if (__dest != (void *)0x0 || uVar4 == 0) {
        if (uVar4 == 0) {
          return pAVar2;
        }
        memcpy(__dest,value.bytes,__size);
        return pAVar2;
      }
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                  ,"amqpvalue_create_binary",0x3f1,1,
                  "Could not allocate memory for binary payload of AMQP value");
      }
      free((void *)((long)&pAVar2[-1].value + 8));
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      pcVar5 = "NULL bytes with non-zero length";
      iVar3 = 0x3d4;
LAB_00158634:
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_create_binary",iVar3,1,pcVar5);
      return (AMQP_VALUE)0x0;
    }
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_binary(amqp_binary value)
{
    AMQP_VALUE result;
    if ((value.bytes == NULL) &&
        (value.length > 0))
    {
        /* Codes_SRS_AMQPVALUE_01_129: [If value.data is NULL and value.length is positive then amqpvalue_create_binary shall return NULL.] */
        LogError("NULL bytes with non-zero length");
        result = NULL;
    }
    else
    {
        result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_127: [amqpvalue_create_binary shall return a handle to an AMQP_VALUE that stores a sequence of bytes.] */
            result->type = AMQP_TYPE_BINARY;
            if (value.length > 0)
            {
                result->value.binary_value.bytes = malloc(value.length);
            }
            else
            {
                result->value.binary_value.bytes = NULL;
            }

            result->value.binary_value.length = value.length;

            if ((result->value.binary_value.bytes == NULL) && (value.length > 0))
            {
                /* Codes_SRS_AMQPVALUE_01_128: [If allocating the AMQP_VALUE fails then amqpvalue_create_binary shall return NULL.] */
                LogError("Could not allocate memory for binary payload of AMQP value");
                REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, result);
                result = NULL;
            }
            else
            {
                if (value.length > 0)
                {
                    (void)memcpy((void*)result->value.binary_value.bytes, value.bytes, value.length);
                }
            }
        }
    }

    return result;
}